

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QExpression.hpp
# Opt level: O0

void Qentem::QExpression::PowerOf(SizeT64 *left,SizeT64 right)

{
  SizeT64 SVar1;
  SizeT64 num;
  SizeT64 right_local;
  SizeT64 *left_local;
  
  if (1 < right) {
    if ((right & 1) == 0) {
      PowerOf(left,right >> 1);
      *left = *left * *left;
    }
    else {
      SVar1 = *left;
      PowerOf(left,right - 1 >> 1);
      *left = *left * *left;
      *left = SVar1 * *left;
    }
  }
  return;
}

Assistant:

static void PowerOf(SizeT64 &left, SizeT64 right) noexcept {
        if (right > 1U) {
            if ((right & SizeT64{1}) == SizeT64{0}) {
                PowerOf(left, (right / 2U));
                left *= left;
            } else {
                --right;
                const SizeT64 num = left;
                PowerOf(left, (right / SizeT64{2}));
                left *= left;
                left *= num;
            }
        }
    }